

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

CNode * __thiscall
CConnman::ConnectNode
          (CConnman *this,CAddress addrConnect,char *pszDest,bool fCountFailure,
          ConnectionType conn_type,bool use_v2transport)

{
  atomic<long> *paVar1;
  uint64_t data;
  _Elt_pointer puVar2;
  _Map_pointer ppuVar3;
  AddrMan *this_00;
  double dVar4;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  DNSLookupFn dns_lookup_function;
  pointer pCVar5;
  pointer __last;
  pointer pCVar6;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  undefined1 auVar9 [8];
  bool bVar10;
  uint16_t uVar11;
  Network net;
  Logger *pLVar12;
  size_t sVar13;
  time_point tVar14;
  CNode *pCVar15;
  Session *pSVar16;
  CSipHasher *pCVar17;
  uint64_t nKeyedNetGroupIn;
  CAddress *addrIn;
  undefined7 in_register_00000011;
  pointer __p;
  char *pcVar18;
  int iVar19;
  undefined7 in_register_00000081;
  double *in_R9;
  double *args_2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> address;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view in;
  string_view logging_function_00;
  string_view source_file_02;
  string_view source_file_03;
  shared_ptr<Sock> sock_00;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> i2p_transient_session;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock26;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock27;
  CAddress addr_bind;
  Proxy proxy;
  unique_ptr<Sock,_std::default_delete<Sock>_> sock;
  string log_msg;
  uint16_t port;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  char *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb8;
  uint in_stack_fffffffffffffcbc;
  direct_or_indirect *pdVar20;
  uint uVar21;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  CNodeOptions *in_stack_fffffffffffffcd0;
  uint16_t local_31a;
  CNode *local_318;
  undefined1 local_30c;
  bool local_2f4;
  undefined1 local_2d0 [16];
  _Any_data local_2c0;
  code *local_2b0;
  vector<CService,_std::allocator<CService>_> local_2a0;
  vector<CAddress,_std::allocator<CAddress>_> local_288;
  allocator<char> local_261;
  undefined1 local_260 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  direct_or_indirect local_240;
  uint local_230;
  uint64_t local_228;
  uint16_t local_220;
  direct_or_indirect local_218;
  Sock local_208;
  uint64_t local_1f8;
  rep rStack_1f0;
  char *pcStack_1e8;
  direct_or_indirect local_1d8;
  uint local_1c8;
  uint64_t local_1c0;
  undefined2 local_1b8;
  duration local_1b0;
  char *pcStack_1a8;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  _Alloc_hider local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  undefined2 local_150;
  string local_148;
  direct_or_indirect local_128;
  uint local_118;
  uint64_t local_110;
  undefined2 local_108;
  undefined1 local_100 [8];
  undefined1 auStack_f8 [8];
  undefined1 local_f0 [24];
  NodeSeconds local_d8;
  direct_or_indirect dStack_d0;
  uint local_c0;
  string local_78;
  vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> local_58;
  long local_38;
  
  local_260._0_8_ = CONCAT71(in_register_00000011,fCountFailure);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar19 = (int)CONCAT71(in_register_00000081,use_v2transport);
  if (iVar19 == 0) {
    __assert_fail("conn_type != ConnectionType::INBOUND",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                  ,0x187,
                  "CNode *CConnman::ConnectNode(CAddress, const char *, bool, ConnectionType, bool)"
                 );
  }
  args_2 = in_R9;
  if ((char *)local_260._0_8_ == (char *)0x0) {
    bVar10 = IsLocal((CService *)pszDest);
    if (!bVar10) {
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_100,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)pszDest);
      local_f0._8_8_ = *(undefined8 *)(pszDest + 0x18);
      local_f0[0x10] = (undefined1)*(undefined2 *)(pszDest + 0x20);
      local_f0[0x11] = (undefined1)((ushort)*(undefined2 *)(pszDest + 0x20) >> 8);
      pCVar15 = FindNode(this,(CService *)local_100);
      if (0x10 < (uint)local_f0._0_4_) {
        free((void *)local_100);
        local_100 = (undefined1  [8])0x0;
      }
      if (pCVar15 == (CNode *)0x0) goto LAB_0019db32;
      logging_function._M_str = "ConnectNode";
      logging_function._M_len = 0xb;
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file_02._M_len = 0x50;
      ::LogPrintf_<>(logging_function,source_file_02,0x191,ALL,Info,
                     "Failed to open new connection, already connected\n");
    }
    local_318 = (CNode *)0x0;
  }
  else {
LAB_0019db32:
    pLVar12 = LogInstance();
    bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar12,NET,Debug);
    uVar7 = local_260._0_8_;
    local_30c = SUB81(in_R9,0);
    if (bVar10) {
      pcVar18 = "v1";
      if (local_30c != NET_UNROUTABLE) {
        pcVar18 = "v2";
      }
      if ((char *)local_260._0_8_ == (char *)0x0) {
        CService::ToStringAddrPort_abi_cxx11_(&local_78,(CService *)pszDest);
      }
      else {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        sVar13 = strlen((char *)local_260._0_8_);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,uVar7,(char *)(uVar7 + sVar13));
      }
      dVar4 = 0.0;
      if ((char *)local_260._0_8_ == (char *)0x0) {
        tVar14 = NodeClock::now();
        dVar4 = (double)((long)tVar14.__d.__r / 1000000000 - *(long *)(pszDest + 0x28));
      }
      local_148._M_dataplus._M_p = (pointer)(dVar4 / 3600.0);
      pLVar12 = LogInstance();
      bVar10 = BCLog::Logger::Enabled(pLVar12);
      if (bVar10) {
        auStack_f8 = (undefined1  [8])0x0;
        local_f0._0_4_ = local_f0._0_4_ & 0xffffff00;
        local_100 = (undefined1  [8])local_f0;
        tinyformat::format<char[3],std::__cxx11::string,double>
                  ((string *)local_198,(tinyformat *)"trying %s connection %s lastseen=%.1fhrs\n",
                   pcVar18,(char (*) [3])&local_78,&local_148,args_2);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._0_8_ != &local_188) {
          operator_delete((void *)local_198._0_8_,
                          CONCAT44(local_188._M_allocated_capacity._4_4_,
                                   local_188._M_allocated_capacity._0_4_) + 1);
        }
        pLVar12 = LogInstance();
        local_198._0_8_ = &DAT_00000050;
        local_198._8_8_ =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
        in_stack_fffffffffffffca8 = 0x50;
        in_stack_fffffffffffffcac = 0;
        in_stack_fffffffffffffcb0 =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
        in_stack_fffffffffffffcc0 = 1;
        in_stack_fffffffffffffcb8 = 1;
        in_stack_fffffffffffffcbc = 0;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
        source_file_00._M_len = 0x50;
        str_00._M_str = (char *)local_100;
        str_00._M_len = (size_t)auStack_f8;
        logging_function_02._M_str = "ConnectNode";
        logging_function_02._M_len = 0xb;
        BCLog::Logger::LogPrintStr
                  (pLVar12,str_00,logging_function_02,source_file_00,0x199,NET,Debug);
        if (local_100 != (undefined1  [8])local_f0) {
          operator_delete((void *)local_100,CONCAT44(local_f0._4_4_,local_f0._0_4_) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
    if ((char *)local_260._0_8_ == (char *)0x0) {
      local_31a = this->m_params->nDefaultPort;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,(char *)local_260._0_8_,&local_261);
      local_31a = GetDefaultPort(this,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
    local_288.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
    super__Vector_impl_data._M_start = (CAddress *)0x0;
    local_288.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
    super__Vector_impl_data._M_finish = (CAddress *)0x0;
    local_288.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((char *)local_260._0_8_ == (char *)0x0) {
      std::vector<CAddress,_std::allocator<CAddress>_>::push_back(&local_288,(value_type *)pszDest);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_100,(char *)local_260._0_8_,(allocator<char> *)local_198);
      if (fNameLookup == true) {
        bVar10 = HaveNameProxy();
        bVar10 = !bVar10;
      }
      else {
        bVar10 = false;
      }
      std::
      function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
      ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                  *)&local_2c0,&g_dns_lookup_abi_cxx11_);
      pcVar18 = (char *)0x100;
      dns_lookup_function.super__Function_base._M_functor._4_4_ = in_stack_fffffffffffffcac;
      dns_lookup_function.super__Function_base._M_functor._0_4_ = in_stack_fffffffffffffca8;
      dns_lookup_function.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffcb0;
      dns_lookup_function.super__Function_base._M_manager._0_4_ = in_stack_fffffffffffffcb8;
      dns_lookup_function.super__Function_base._M_manager._4_4_ = in_stack_fffffffffffffcbc;
      dns_lookup_function._M_invoker._0_4_ = in_stack_fffffffffffffcc0;
      dns_lookup_function._M_invoker._4_4_ = in_stack_fffffffffffffcc4;
      Lookup(&local_2a0,(string *)local_100,local_31a,bVar10,0x100,dns_lookup_function);
      if (local_2b0 != (code *)0x0) {
        (*local_2b0)(&local_2c0,&local_2c0,__destroy_functor);
      }
      if (local_100 != (undefined1  [8])local_f0) {
        operator_delete((void *)local_100,CONCAT44(local_f0._4_4_,local_f0._0_4_) + 1);
      }
      __last = local_2a0.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pCVar5 = local_2a0.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_2a0.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_2a0.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<CAddress,_std::allocator<CAddress>_>::push_back
                  (&local_288,(value_type *)pszDest);
      }
      else {
        FastRandomContext::FastRandomContext((FastRandomContext *)local_100,false);
        std::
        shuffle<__gnu_cxx::__normal_iterator<CService*,std::vector<CService,std::allocator<CService>>>,FastRandomContext>
                  ((__normal_iterator<CService_*,_std::vector<CService,_std::allocator<CService>_>_>
                   )pCVar5,(__normal_iterator<CService_*,_std::vector<CService,_std::allocator<CService>_>_>
                            )__last,(FastRandomContext *)local_100);
        ChaCha20::~ChaCha20((ChaCha20 *)local_f0);
        if (local_2a0.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_2a0.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pSVar16 = (Session *)
                    local_2a0.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            MaybeFlipIPv6toCJDNS((CService *)&local_128.indirect_contents,(CService *)pSVar16);
            prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_100,
                       (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                       &local_128.indirect_contents);
            local_f0._8_8_ = local_110;
            local_f0[0x10] = (undefined1)local_108;
            local_f0[0x11] = (undefined1)((ushort)local_108 >> 8);
            local_d8.__d.__r = (duration)100000000;
            dStack_d0.indirect_contents.indirect = (char *)0x0;
            if (0x10 < *(uint *)(pszDest + 0x10)) {
              free(*(void **)pszDest);
            }
            *(undefined1 (*) [8])pszDest = local_100;
            *(undefined1 (*) [8])(pszDest + 8) = auStack_f8;
            *(undefined4 *)(pszDest + 0x10) = local_f0._0_4_;
            local_f0._0_4_ = 0;
            *(undefined8 *)(pszDest + 0x18) = local_f0._8_8_;
            *(ushort *)(pszDest + 0x20) = CONCAT11(local_f0[0x11],local_f0[0x10]);
            ((duration *)(pszDest + 0x28))->__r = (rep)local_d8.__d.__r;
            *(char **)(pszDest + 0x30) = dStack_d0.indirect_contents.indirect;
            if (0x10 < local_118) {
              free(local_128.indirect_contents.indirect);
              local_128.indirect_contents.indirect = (char *)0x0;
            }
            bVar10 = CNetAddr::IsValid((CNetAddr *)pszDest);
            if (!bVar10) {
              pLVar12 = LogInstance();
              bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar12,NET,Debug);
              if (bVar10) {
                CService::ToStringAddrPort_abi_cxx11_(&local_148,(CService *)pszDest);
                pLVar12 = LogInstance();
                bVar10 = BCLog::Logger::Enabled(pLVar12);
                if (bVar10) {
                  local_100 = (undefined1  [8])local_f0;
                  auStack_f8 = (undefined1  [8])0x0;
                  local_f0._0_4_ = local_f0._0_4_ & 0xffffff00;
                  tinyformat::format<std::__cxx11::string,char_const*>
                            ((string *)local_198,
                             (tinyformat *)"Resolver returned invalid address %s for %s\n",
                             (char *)&local_148,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_260,(char **)pcVar18);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_100,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_198);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_198._0_8_ != &local_188) {
                    operator_delete((void *)local_198._0_8_,
                                    CONCAT44(local_188._M_allocated_capacity._4_4_,
                                             local_188._M_allocated_capacity._0_4_) + 1);
                  }
                  pLVar12 = LogInstance();
                  local_198._0_8_ = &DAT_00000050;
                  local_198._8_8_ =
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                  ;
                  source_file_01._M_str =
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                  ;
                  source_file_01._M_len = 0x50;
                  str_01._M_str = (char *)local_100;
                  str_01._M_len = (size_t)auStack_f8;
                  logging_function_03._M_str = "ConnectNode";
                  logging_function_03._M_len = 0xb;
                  BCLog::Logger::LogPrintStr
                            (pLVar12,str_01,logging_function_03,source_file_01,0x1aa,NET,Debug);
                  if (local_100 != (undefined1  [8])local_f0) {
                    operator_delete((void *)local_100,CONCAT44(local_f0._4_4_,local_f0._0_4_) + 1);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_148._M_dataplus._M_p != &local_148.field_2) {
                  operator_delete(local_148._M_dataplus._M_p,
                                  local_148.field_2._M_allocated_capacity + 1);
                }
              }
LAB_0019f02a:
              std::vector<CService,_std::allocator<CService>_>::~vector(&local_2a0);
              local_318 = (CNode *)0x0;
              goto LAB_0019f040;
            }
            local_250._M_local_buf[8] = '\0';
            local_250._M_allocated_capacity = (size_type)&this->m_nodes_mutex;
            std::unique_lock<std::recursive_mutex>::lock
                      ((unique_lock<std::recursive_mutex> *)(local_260 + 0x10));
            prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_100,
                       (prevector<16U,_unsigned_char,_unsigned_int,_int> *)pszDest);
            local_f0._8_8_ = *(undefined8 *)(pszDest + 0x18);
            local_f0[0x10] = (undefined1)*(undefined2 *)(pszDest + 0x20);
            local_f0[0x11] = (undefined1)((ushort)*(undefined2 *)(pszDest + 0x20) >> 8);
            pCVar15 = FindNode(this,(CService *)local_100);
            if (0x10 < (uint)local_f0._0_4_) {
              free((void *)local_100);
              local_100 = (undefined1  [8])0x0;
            }
            if (pCVar15 == (CNode *)0x0) {
              std::vector<CAddress,_std::allocator<CAddress>_>::push_back
                        (&local_288,(value_type *)pszDest);
            }
            else {
              CService::ToStringAddrPort_abi_cxx11_(&local_148,(CService *)pszDest);
              pLVar12 = LogInstance();
              bVar10 = BCLog::Logger::Enabled(pLVar12);
              if (bVar10) {
                local_100 = (undefined1  [8])local_f0;
                auStack_f8 = (undefined1  [8])0x0;
                local_f0._0_4_ = local_f0._0_4_ & 0xffffff00;
                tinyformat::format<char_const*,std::__cxx11::string>
                          ((string *)local_198,
                           (tinyformat *)"Not opening a connection to %s, already connected to %s\n"
                           ,local_260,(char **)&local_148,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pcVar18);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_100,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_198);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._0_8_ != &local_188) {
                  operator_delete((void *)local_198._0_8_,
                                  CONCAT44(local_188._M_allocated_capacity._4_4_,
                                           local_188._M_allocated_capacity._0_4_) + 1);
                }
                pLVar12 = LogInstance();
                local_198._0_8_ = &DAT_00000050;
                local_198._8_8_ =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                ;
                in_stack_fffffffffffffcc0 = 2;
                in_stack_fffffffffffffcbc = 0xffffffff;
                source_file._M_str =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                ;
                source_file._M_len = 0x50;
                str._M_str = (char *)local_100;
                str._M_len = (size_t)auStack_f8;
                logging_function_01._M_str = "ConnectNode";
                logging_function_01._M_len = 0xb;
                pcVar18 = "ConnectNode";
                BCLog::Logger::LogPrintStr
                          (pLVar12,str,logging_function_01,source_file,0x1b2,ALL,Info);
                if (local_100 != (undefined1  [8])local_f0) {
                  operator_delete((void *)local_100,CONCAT44(local_f0._4_4_,local_f0._0_4_) + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                operator_delete(local_148._M_dataplus._M_p,
                                local_148.field_2._M_allocated_capacity + 1);
              }
            }
            std::unique_lock<std::recursive_mutex>::~unique_lock
                      ((unique_lock<std::recursive_mutex> *)(local_260 + 0x10));
            if (pCVar15 != (CNode *)0x0) goto LAB_0019f02a;
            pSVar16 = (Session *)&pSVar16->m_control_host;
          } while (pSVar16 !=
                   (Session *)
                   local_2a0.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
      }
      std::vector<CService,_std::allocator<CService>_>::~vector(&local_2a0);
    }
    local_148._M_dataplus._M_p = (pointer)0x0;
    CService::CService((CService *)local_198);
    local_170._M_p = (pointer)&local_160;
    local_168 = 0;
    local_160._M_local_buf[0] = '\0';
    local_150._0_1_ = false;
    local_150._1_1_ = false;
    CService::CService((CService *)&local_1d8.indirect_contents);
    local_1b0.__r = 100000000;
    pcStack_1a8 = (char *)0x0;
    bVar10 = CNetAddr::IsValid((CNetAddr *)&local_1d8.indirect_contents);
    pCVar6 = local_288.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar20 = (direct_or_indirect *)((ulong)in_stack_fffffffffffffcbc << 0x20);
    if (bVar10) {
      __assert_fail("!addr_bind.IsValid()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                    ,0x1c5,
                    "CNode *CConnman::ConnectNode(CAddress, const char *, bool, ConnectionType, bool)"
                   );
    }
    local_2a0.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    if (local_288.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_288.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_318 = (CNode *)0x0;
      address._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_288.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
           super__Vector_impl_data._M_start;
      do {
        bVar10 = CNetAddr::IsValid((CNetAddr *)address._M_pi);
        if (bVar10) {
          net = CNetAddr::GetNetwork((CNetAddr *)address._M_pi);
          bVar10 = GetProxy(net,(Proxy *)local_198);
          local_250._M_allocated_capacity = local_250._M_allocated_capacity & 0xffffffffffffff00;
          if (bVar10 && address._M_pi[1]._M_use_count == 4) {
            local_100 = (undefined1  [8])0x0;
            CService::CService((CService *)auStack_f8);
            CService::CService((CService *)&dStack_d0.indirect_contents);
            pSVar16 = (this->m_i2p_sam_session)._M_t.
                      super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                      .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
            if (pSVar16 == (Session *)0x0) {
              local_218._8_8_ = local_218._8_8_ & 0xffffffffffffff00;
              local_218.indirect_contents.indirect = (char *)&this->m_unused_i2p_sessions_mutex;
              std::unique_lock<std::mutex>::lock
                        ((unique_lock<std::mutex> *)&local_218.indirect_contents);
              puVar2 = (this->m_unused_i2p_sessions).c.
                       super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur;
              if ((this->m_unused_i2p_sessions).c.
                  super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur == puVar2) {
                pSVar16 = (Session *)operator_new(0x118);
                i2p::sam::Session::Session(pSVar16,(Proxy *)local_198,&this->interruptNet);
                pCVar5 = local_2a0.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
                         super__Vector_impl_data._M_start;
                local_58.
                super__Vector_base<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                bVar10 = (Session *)
                         local_2a0.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
                         super__Vector_impl_data._M_start != (Session *)0x0;
                local_2a0.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)pSVar16;
                if (bVar10) {
                  i2p::sam::Session::~Session((Session *)pCVar5);
                  operator_delete(pCVar5,0x118);
                }
                std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::
                ~unique_ptr((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                             *)&local_58);
              }
              else {
                pSVar16 = (puVar2->_M_t).
                          super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                          .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
                (puVar2->_M_t).
                super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
                _M_t.
                super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
                     (Session *)
                     local_2a0.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
                     super__Vector_impl_data._M_start;
                local_2a0.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)pSVar16;
                std::
                deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                ::pop_front(&(this->m_unused_i2p_sessions).c);
              }
              std::unique_lock<std::mutex>::~unique_lock
                        ((unique_lock<std::mutex> *)&local_218.indirect_contents);
              bVar10 = i2p::sam::Session::Connect
                                 ((Session *)
                                  local_2a0.super__Vector_base<CService,_std::allocator<CService>_>.
                                  _M_impl.super__Vector_impl_data._M_start,(CService *)address._M_pi
                                  ,(Connection *)local_100,(bool *)(local_260 + 0x10));
              if (!bVar10) {
                local_218._8_8_ = local_218._8_8_ & 0xffffffffffffff00;
                local_218.indirect_contents.indirect = (char *)&this->m_unused_i2p_sessions_mutex;
                std::unique_lock<std::mutex>::lock
                          ((unique_lock<std::mutex> *)&local_218.indirect_contents);
                pCVar5 = local_2a0.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
                         super__Vector_impl_data._M_start;
                ppuVar3 = (this->m_unused_i2p_sessions).c.
                          super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node;
                if (((long)(this->m_unused_i2p_sessions).c.
                           super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_last -
                     (long)(this->m_unused_i2p_sessions).c.
                           super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                    ((long)(this->m_unused_i2p_sessions).c.
                           super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                     (long)(this->m_unused_i2p_sessions).c.
                           super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                    ((((ulong)((long)ppuVar3 -
                              (long)(this->m_unused_i2p_sessions).c.
                                    super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                    (ulong)(ppuVar3 == (_Map_pointer)0x0)) * 0x40 < 10) {
                  local_2a0.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_58.
                  super__Vector_base<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)pCVar5;
                  std::
                  deque<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>,std::allocator<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>>>
                  ::emplace_back<i2p::sam::Session*>
                            ((deque<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>,std::allocator<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>>>
                              *)&this->m_unused_i2p_sessions,(Session **)&local_58);
                }
                std::unique_lock<std::mutex>::~unique_lock
                          ((unique_lock<std::mutex> *)&local_218.indirect_contents);
              }
            }
            else {
              bVar10 = i2p::sam::Session::Connect
                                 (pSVar16,(CService *)address._M_pi,(Connection *)local_100,
                                  (bool *)(local_260 + 0x10));
            }
            auVar9 = local_100;
            _Var8._M_p = local_148._M_dataplus._M_p;
            if (bVar10 != false) {
              local_100 = (undefined1  [8])0x0;
              local_148._M_dataplus._M_p = (pointer)auVar9;
              if ((Sock *)_Var8._M_p != (Sock *)0x0) {
                (**(code **)(*(long *)_Var8._M_p + 8))();
              }
              prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                         &local_240.indirect_contents,
                         (prevector<16U,_unsigned_char,_unsigned_int,_int> *)auStack_f8);
              local_228 = CONCAT62(local_f0._18_6_,CONCAT11(local_f0[0x11],local_f0[0x10]));
              local_220 = (uint16_t)local_d8.__d.__r;
              prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                         &local_218.indirect_contents,
                         (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                         &local_240.indirect_contents);
              local_208._8_8_ = local_228;
              local_1f8 = CONCAT62(local_1f8._2_6_,local_220);
              rStack_1f0 = 100000000;
              pcStack_1e8 = (char *)0x0;
              if (0x10 < local_1c8) {
                free(local_1d8.indirect_contents.indirect);
              }
              local_1d8.indirect_contents.indirect = local_218.indirect_contents.indirect;
              local_1d8._8_8_ = local_218._8_8_;
              local_1c8 = (uint)local_208._vptr_Sock;
              local_208._vptr_Sock =
                   (_func_int **)((ulong)local_208._vptr_Sock & 0xffffffff00000000);
              local_1c0 = local_208._8_8_;
              local_1b8 = (undefined2)local_1f8;
              local_1b0.__r = rStack_1f0;
              pcStack_1a8 = pcStack_1e8;
              if (0x10 < local_230) {
                free(local_240.indirect_contents.indirect);
                local_240.indirect_contents.indirect = (char *)0x0;
              }
            }
            if (0x10 < local_c0) {
              free(dStack_d0.indirect_contents.indirect);
              dStack_d0.indirect_contents.indirect = (char *)0x0;
            }
            if (0x10 < (uint)local_f0._8_4_) {
              free((void *)auStack_f8);
              auStack_f8 = (undefined1  [8])0x0;
            }
LAB_0019eb97:
            if (local_100 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_100 + 8))();
            }
          }
          else {
            if (!bVar10) {
              ConnectDirectly((CService *)local_100,SUB81(address._M_pi,0));
              auVar9 = local_100;
              _Var8._M_p = local_148._M_dataplus._M_p;
              local_100 = (undefined1  [8])0x0;
              local_148._M_dataplus._M_p = (pointer)auVar9;
              if ((Sock *)_Var8._M_p != (Sock *)0x0) {
                (**(code **)(*(long *)_Var8._M_p + 8))();
              }
              goto LAB_0019eb97;
            }
            pLVar12 = LogInstance();
            bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar12,PROXY,Debug);
            if (bVar10) {
              Proxy::ToString_abi_cxx11_((string *)local_100,(Proxy *)local_198);
              CService::ToStringAddrPort_abi_cxx11_
                        ((string *)&local_218.indirect_contents,(CService *)address._M_pi);
              logging_function_00._M_str = "ConnectNode";
              logging_function_00._M_len = 0xb;
              source_file_03._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
              ;
              source_file_03._M_len = 0x50;
              pdVar20 = &local_218;
              ::LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                        (logging_function_00,source_file_03,0x1ec,PROXY,0x80f73c,local_100,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_218.indirect_contents,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
              if ((Sock *)local_218.indirect_contents.indirect != &local_208) {
                operator_delete(local_218.indirect_contents.indirect,(long)local_208._vptr_Sock + 1)
                ;
              }
              if (local_100 != (undefined1  [8])local_f0) {
                operator_delete((void *)local_100,CONCAT44(local_f0._4_4_,local_f0._0_4_) + 1);
              }
            }
            CNetAddr::ToStringAddr_abi_cxx11_((string *)local_100,(CNetAddr *)address._M_pi);
            uVar11 = CService::GetPort((CService *)address._M_pi);
            ConnectThroughProxy((Proxy *)&local_218.indirect_contents,(string *)local_198,
                                (uint16_t)local_100,(bool *)(ulong)uVar11);
            _Var8._M_p = local_148._M_dataplus._M_p;
            local_148._M_dataplus._M_p = local_218.indirect_contents.indirect;
            local_218.indirect_contents.indirect = (char *)0x0;
            if ((Sock *)_Var8._M_p != (Sock *)0x0) {
              (**(code **)(*(long *)_Var8._M_p + 8))();
            }
            if ((long *)local_218.indirect_contents.indirect != (long *)0x0) {
              (**(code **)(*(long *)local_218.indirect_contents.indirect + 8))();
            }
            local_218.indirect_contents.indirect = (char *)0x0;
            if (local_100 != (undefined1  [8])local_f0) {
              operator_delete((void *)local_100,CONCAT44(local_f0._4_4_,local_f0._0_4_) + 1);
            }
          }
          if (local_250._M_local_buf[0] == '\0') {
            this_00 = this->addrman;
            tVar14 = NodeClock::now();
            local_2f4 = SUB41(conn_type,0);
            AddrMan::Attempt(this_00,(CService *)address._M_pi,local_2f4,
                             (NodeSeconds)((long)tVar14.__d.__r / 1000000000));
          }
        }
        else if (((char *)local_260._0_8_ != (char *)0x0) &&
                (bVar10 = GetNameProxy((Proxy *)local_198), bVar10)) {
          local_100 = (undefined1  [8])local_f0;
          auStack_f8 = (undefined1  [8])0x0;
          local_f0._0_4_ = local_f0._0_4_ & 0xffffff00;
          local_58.
          super__Vector_base<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT62(local_58.
                                 super__Vector_base<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>
                                 ._M_impl.super__Vector_impl_data._M_start._2_6_,local_31a);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_218.indirect_contents,(char *)local_260._0_8_,
                     (allocator<char> *)(local_260 + 0x10));
          in._M_str = local_218.indirect_contents.indirect;
          in._M_len = local_218._8_8_;
          SplitHostPort(in,(uint16_t *)&local_58,(string *)local_100);
          if ((Sock *)local_218.indirect_contents.indirect != &local_208) {
            operator_delete(local_218.indirect_contents.indirect,(long)local_208._vptr_Sock + 1);
          }
          ConnectThroughProxy((Proxy *)&local_218.indirect_contents,(string *)local_198,
                              (uint16_t)local_100,
                              (bool *)((ulong)local_58.
                                              super__Vector_base<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>
                                              ._M_impl.super__Vector_impl_data._M_start & 0xffff));
          _Var8._M_p = local_148._M_dataplus._M_p;
          local_148._M_dataplus._M_p = local_218.indirect_contents.indirect;
          local_218.indirect_contents.indirect = (char *)0x0;
          if ((Sock *)_Var8._M_p != (Sock *)0x0) {
            (**(code **)(*(long *)_Var8._M_p + 8))();
          }
          if ((Sock *)local_218.indirect_contents.indirect != (Sock *)0x0) {
            (**(code **)(*(long *)local_218.indirect_contents.indirect + 8))();
          }
          if (local_100 != (undefined1  [8])local_f0) {
            operator_delete((void *)local_100,CONCAT44(local_f0._4_4_,local_f0._0_4_) + 1);
          }
        }
        _Var8._M_p = local_148._M_dataplus._M_p;
        if ((Sock *)local_148._M_dataplus._M_p != (Sock *)0x0) {
          local_250._M_allocated_capacity = local_250._M_allocated_capacity & 0xffffffff00000000;
          if (iVar19 == 2) {
            std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::vector
                      (&local_58,&this->vWhitelistedRangeOutgoing);
          }
          else {
            local_58.
            super__Vector_base<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_58.
            super__Vector_base<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_58.
            super__Vector_base<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          }
          AddWhitelistPermissionFlags
                    (this,(NetPermissionFlags *)(local_260 + 0x10),(CNetAddr *)address._M_pi,
                     &local_58);
          LOCK();
          paVar1 = &this->nLastNodeId;
          data = (paVar1->super___atomic_base<long>)._M_i;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
          UNLOCK();
          CSipHasher::CSipHasher((CSipHasher *)local_100,this->nSeed0,this->nSeed1);
          pCVar17 = CSipHasher::Write((CSipHasher *)local_100,0xd93e69e2bbfa5735);
          local_218.indirect_contents.indirect = (char *)pCVar17->v[0];
          local_218._8_8_ = pCVar17->v[1];
          local_208._vptr_Sock = (_func_int **)pCVar17->v[2];
          local_208._8_8_ = pCVar17->v[3];
          local_1f8 = pCVar17->tmp;
          rStack_1f0 = *(rep *)&pCVar17->count;
          pCVar17 = CSipHasher::Write((CSipHasher *)&local_218.indirect_contents,data);
          nKeyedNetGroupIn = CSipHasher::Finalize(pCVar17);
          bVar10 = CNetAddr::IsValid((CNetAddr *)&local_1d8.indirect_contents);
          if (!bVar10) {
            GetBindAddress((CAddress *)local_100,(Sock *)local_148._M_dataplus._M_p);
            if (0x10 < local_1c8) {
              free(local_1d8.indirect_contents.indirect);
            }
            local_1d8.indirect_contents.indirect = (char *)local_100;
            local_1d8._8_8_ = auStack_f8;
            local_1c8 = local_f0._0_4_;
            local_f0._0_4_ = 0;
            local_1c0 = local_f0._8_8_;
            local_1b8 = CONCAT11(local_f0[0x11],local_f0[0x10]);
            local_1b0 = local_d8.__d.__r;
            pcStack_1a8 = dStack_d0.indirect_contents.indirect;
          }
          local_318 = (CNode *)operator_new(0x3a8);
          std::__shared_ptr<Sock,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<Sock,std::default_delete<Sock>,void>
                    ((__shared_ptr<Sock,(__gnu_cxx::_Lock_policy)2> *)local_2d0,
                     (unique_ptr<Sock,_std::default_delete<Sock>_> *)&local_148);
          addrIn = (CAddress *)CalculateKeyedNetGroup(this,(CAddress *)address._M_pi);
          uVar21 = (uint)((ulong)pdVar20 >> 0x20);
          pcVar18 = (char *)local_260._0_8_;
          if ((char *)local_260._0_8_ == (char *)0x0) {
            pcVar18 = "";
          }
          local_218.indirect_contents.indirect = (char *)&local_208;
          sVar13 = strlen(pcVar18);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_218,pcVar18,pcVar18 + sVar13);
          local_100._0_4_ = local_250._M_allocated_capacity._0_4_;
          auStack_f8 = (undefined1  [8])
                       local_2a0.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
                       super__Vector_impl_data._M_start;
          local_2a0.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_f0._0_4_ = local_f0._0_4_ & 0xffffff00;
          local_f0._8_8_ = ZEXT48(this->nReceiveFloodSize);
          in_stack_fffffffffffffcc0 = 0;
          sock_00.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               address._M_pi;
          sock_00.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_2d0;
          local_f0[0x10] = local_30c;
          CNode::CNode(local_318,data,sock_00,addrIn,nKeyedNetGroupIn,(uint64_t)&local_1d8,
                       (CAddress *)&local_218.indirect_contents,(string *)CONCAT44(uVar21,iVar19),
                       INBOUND,false,in_stack_fffffffffffffcd0);
          std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
                    ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
                     auStack_f8);
          if ((Sock *)local_218.indirect_contents.indirect != &local_208) {
            operator_delete(local_218.indirect_contents.indirect,(long)local_208._vptr_Sock + 1);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0._8_8_);
          }
          LOCK();
          (local_318->nRefCount).super___atomic_base<int>._M_i =
               (local_318->nRefCount).super___atomic_base<int>._M_i + 1;
          UNLOCK();
          RandAddEvent((uint32_t)data);
          std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::~vector
                    (&local_58);
          pdVar20 = (direct_or_indirect *)((ulong)uVar21 << 0x20);
        }
        if ((Sock *)_Var8._M_p != (Sock *)0x0) goto LAB_0019ef34;
        address._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&address._M_pi[3]._M_use_count;
      } while ((pointer)address._M_pi != pCVar6);
    }
    local_318 = (CNode *)0x0;
LAB_0019ef34:
    std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
              ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)&local_2a0)
    ;
    if (0x10 < local_1c8) {
      free(local_1d8.indirect_contents.indirect);
      local_1d8.indirect_contents.indirect = (char *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_p != &local_160) {
      operator_delete(local_170._M_p,
                      CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0]) + 1)
      ;
    }
    if (0x10 < (uint)local_188._M_allocated_capacity._0_4_) {
      free((void *)local_198._0_8_);
      local_198._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
    }
    if ((Sock *)local_148._M_dataplus._M_p != (Sock *)0x0) {
      (**(code **)(*(long *)local_148._M_dataplus._M_p + 8))();
    }
LAB_0019f040:
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_288);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return local_318;
  }
  __stack_chk_fail();
}

Assistant:

CNode* CConnman::ConnectNode(CAddress addrConnect, const char *pszDest, bool fCountFailure, ConnectionType conn_type, bool use_v2transport)
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    assert(conn_type != ConnectionType::INBOUND);

    if (pszDest == nullptr) {
        if (IsLocal(addrConnect))
            return nullptr;

        // Look for an existing connection
        CNode* pnode = FindNode(static_cast<CService>(addrConnect));
        if (pnode)
        {
            LogPrintf("Failed to open new connection, already connected\n");
            return nullptr;
        }
    }

    LogPrintLevel(BCLog::NET, BCLog::Level::Debug, "trying %s connection %s lastseen=%.1fhrs\n",
        use_v2transport ? "v2" : "v1",
        pszDest ? pszDest : addrConnect.ToStringAddrPort(),
        Ticks<HoursDouble>(pszDest ? 0h : Now<NodeSeconds>() - addrConnect.nTime));

    // Resolve
    const uint16_t default_port{pszDest != nullptr ? GetDefaultPort(pszDest) :
                                                     m_params.GetDefaultPort()};

    // Collection of addresses to try to connect to: either all dns resolved addresses if a domain name (pszDest) is provided, or addrConnect otherwise.
    std::vector<CAddress> connect_to{};
    if (pszDest) {
        std::vector<CService> resolved{Lookup(pszDest, default_port, fNameLookup && !HaveNameProxy(), 256)};
        if (!resolved.empty()) {
            std::shuffle(resolved.begin(), resolved.end(), FastRandomContext());
            // If the connection is made by name, it can be the case that the name resolves to more than one address.
            // We don't want to connect any more of them if we are already connected to one
            for (const auto& r : resolved) {
                addrConnect = CAddress{MaybeFlipIPv6toCJDNS(r), NODE_NONE};
                if (!addrConnect.IsValid()) {
                    LogDebug(BCLog::NET, "Resolver returned invalid address %s for %s\n", addrConnect.ToStringAddrPort(), pszDest);
                    return nullptr;
                }
                // It is possible that we already have a connection to the IP/port pszDest resolved to.
                // In that case, drop the connection that was just created.
                LOCK(m_nodes_mutex);
                CNode* pnode = FindNode(static_cast<CService>(addrConnect));
                if (pnode) {
                    LogPrintf("Not opening a connection to %s, already connected to %s\n", pszDest, addrConnect.ToStringAddrPort());
                    return nullptr;
                }
                // Add the address to the resolved addresses vector so we can try to connect to it later on
                connect_to.push_back(addrConnect);
            }
        } else {
            // For resolution via proxy
            connect_to.push_back(addrConnect);
        }
    } else {
        // Connect via addrConnect directly
        connect_to.push_back(addrConnect);
    }

    // Connect
    std::unique_ptr<Sock> sock;
    Proxy proxy;
    CAddress addr_bind;
    assert(!addr_bind.IsValid());
    std::unique_ptr<i2p::sam::Session> i2p_transient_session;

    for (auto& target_addr: connect_to) {
        if (target_addr.IsValid()) {
            const bool use_proxy{GetProxy(target_addr.GetNetwork(), proxy)};
            bool proxyConnectionFailed = false;

            if (target_addr.IsI2P() && use_proxy) {
                i2p::Connection conn;
                bool connected{false};

                if (m_i2p_sam_session) {
                    connected = m_i2p_sam_session->Connect(target_addr, conn, proxyConnectionFailed);
                } else {
                    {
                        LOCK(m_unused_i2p_sessions_mutex);
                        if (m_unused_i2p_sessions.empty()) {
                            i2p_transient_session =
                                std::make_unique<i2p::sam::Session>(proxy, &interruptNet);
                        } else {
                            i2p_transient_session.swap(m_unused_i2p_sessions.front());
                            m_unused_i2p_sessions.pop();
                        }
                    }
                    connected = i2p_transient_session->Connect(target_addr, conn, proxyConnectionFailed);
                    if (!connected) {
                        LOCK(m_unused_i2p_sessions_mutex);
                        if (m_unused_i2p_sessions.size() < MAX_UNUSED_I2P_SESSIONS_SIZE) {
                            m_unused_i2p_sessions.emplace(i2p_transient_session.release());
                        }
                    }
                }

                if (connected) {
                    sock = std::move(conn.sock);
                    addr_bind = CAddress{conn.me, NODE_NONE};
                }
            } else if (use_proxy) {
                LogPrintLevel(BCLog::PROXY, BCLog::Level::Debug, "Using proxy: %s to connect to %s\n", proxy.ToString(), target_addr.ToStringAddrPort());
                sock = ConnectThroughProxy(proxy, target_addr.ToStringAddr(), target_addr.GetPort(), proxyConnectionFailed);
            } else {
                // no proxy needed (none set for target network)
                sock = ConnectDirectly(target_addr, conn_type == ConnectionType::MANUAL);
            }
            if (!proxyConnectionFailed) {
                // If a connection to the node was attempted, and failure (if any) is not caused by a problem connecting to
                // the proxy, mark this as an attempt.
                addrman.Attempt(target_addr, fCountFailure);
            }
        } else if (pszDest && GetNameProxy(proxy)) {
            std::string host;
            uint16_t port{default_port};
            SplitHostPort(std::string(pszDest), port, host);
            bool proxyConnectionFailed;
            sock = ConnectThroughProxy(proxy, host, port, proxyConnectionFailed);
        }
        // Check any other resolved address (if any) if we fail to connect
        if (!sock) {
            continue;
        }

        NetPermissionFlags permission_flags = NetPermissionFlags::None;
        std::vector<NetWhitelistPermissions> whitelist_permissions = conn_type == ConnectionType::MANUAL ? vWhitelistedRangeOutgoing : std::vector<NetWhitelistPermissions>{};
        AddWhitelistPermissionFlags(permission_flags, target_addr, whitelist_permissions);

        // Add node
        NodeId id = GetNewNodeId();
        uint64_t nonce = GetDeterministicRandomizer(RANDOMIZER_ID_LOCALHOSTNONCE).Write(id).Finalize();
        if (!addr_bind.IsValid()) {
            addr_bind = GetBindAddress(*sock);
        }
        CNode* pnode = new CNode(id,
                                std::move(sock),
                                target_addr,
                                CalculateKeyedNetGroup(target_addr),
                                nonce,
                                addr_bind,
                                pszDest ? pszDest : "",
                                conn_type,
                                /*inbound_onion=*/false,
                                CNodeOptions{
                                    .permission_flags = permission_flags,
                                    .i2p_sam_session = std::move(i2p_transient_session),
                                    .recv_flood_size = nReceiveFloodSize,
                                    .use_v2transport = use_v2transport,
                                });
        pnode->AddRef();

        // We're making a new connection, harvest entropy from the time (and our peer count)
        RandAddEvent((uint32_t)id);

        return pnode;
    }

    return nullptr;
}